

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathNodeSetMergeAndClear(xmlNodeSetPtr set1,xmlNodeSetPtr set2)

{
  uint uVar1;
  xmlNodePtr ns;
  xmlNodePtr pxVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  bVar3 = 0 < set2->nodeNr;
  if (0 < set2->nodeNr) {
    uVar1 = set1->nodeNr;
    lVar5 = 0;
    do {
      ns = set2->nodeTab[lVar5];
      if (0 < (int)uVar1) {
        uVar6 = 0;
        do {
          pxVar2 = set1->nodeTab[uVar6];
          if (pxVar2 == ns) goto LAB_001cb1c1;
          if ((((pxVar2->type == XML_NAMESPACE_DECL) && (ns->type == XML_NAMESPACE_DECL)) &&
              ((_xmlNs *)pxVar2->_private == (_xmlNs *)ns->_private)) &&
             (iVar4 = xmlStrEqual((xmlChar *)pxVar2->children,(xmlChar *)ns->children), iVar4 != 0))
          {
            xmlXPathNodeSetFreeNs((xmlNsPtr)ns);
            goto LAB_001cb1c1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
      }
      if ((set1->nodeMax <= set1->nodeNr) && (iVar4 = xmlXPathNodeSetGrow(set1), iVar4 < 0)) {
        if (bVar3) {
          xmlXPathFreeNodeSet(set1);
          xmlXPathNodeSetClearFromPos(set2,0,1);
          return (xmlNodeSetPtr)0x0;
        }
        break;
      }
      iVar4 = set1->nodeNr;
      set1->nodeNr = iVar4 + 1;
      set1->nodeTab[iVar4] = ns;
LAB_001cb1c1:
      set2->nodeTab[lVar5] = (xmlNodePtr)0x0;
      lVar5 = lVar5 + 1;
      bVar3 = lVar5 < set2->nodeNr;
    } while (lVar5 < set2->nodeNr);
  }
  set2->nodeNr = 0;
  return set1;
}

Assistant:

static xmlNodeSetPtr
xmlXPathNodeSetMergeAndClear(xmlNodeSetPtr set1, xmlNodeSetPtr set2)
{
    {
	int i, j, initNbSet1;
	xmlNodePtr n1, n2;

	initNbSet1 = set1->nodeNr;
	for (i = 0;i < set2->nodeNr;i++) {
	    n2 = set2->nodeTab[i];
	    /*
	    * Skip duplicates.
	    */
	    for (j = 0; j < initNbSet1; j++) {
		n1 = set1->nodeTab[j];
		if (n1 == n2) {
		    goto skip_node;
		} else if ((n1->type == XML_NAMESPACE_DECL) &&
		    (n2->type == XML_NAMESPACE_DECL))
		{
		    if ((((xmlNsPtr) n1)->next == ((xmlNsPtr) n2)->next) &&
			(xmlStrEqual(((xmlNsPtr) n1)->prefix,
			((xmlNsPtr) n2)->prefix)))
		    {
			/*
			* Free the namespace node.
			*/
			xmlXPathNodeSetFreeNs((xmlNsPtr) n2);
			goto skip_node;
		    }
		}
	    }
	    /*
	    * grow the nodeTab if needed
	    */
            if (set1->nodeNr >= set1->nodeMax) {
                if (xmlXPathNodeSetGrow(set1) < 0)
                    goto error;
            }
	    set1->nodeTab[set1->nodeNr++] = n2;
skip_node:
            set2->nodeTab[i] = NULL;
	}
    }
    set2->nodeNr = 0;
    return(set1);

error:
    xmlXPathFreeNodeSet(set1);
    xmlXPathNodeSetClear(set2, 1);
    return(NULL);
}